

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O2

void __thiscall ev3dev::remote_control::on_value_changed(remote_control *this,int value)

{
  uint uVar1;
  uint __args;
  
  __args = 0;
  if (value - 1U < 0xb) {
    __args = *(uint *)(&DAT_0016a0d4 + (ulong)(value - 1U) * 4);
  }
  uVar1 = this->_state;
  if (((__args & 1) != (uVar1 & 1)) &&
     ((this->on_red_up).super__Function_base._M_manager != (_Manager_type)0x0)) {
    std::function<void_(bool)>::operator()(&this->on_red_up,SUB41(__args & 1,0));
    uVar1 = this->_state;
  }
  if (((__args & 2) != (uVar1 & 2)) &&
     ((this->on_red_down).super__Function_base._M_manager != (_Manager_type)0x0)) {
    std::function<void_(bool)>::operator()(&this->on_red_down,(__args & 2) != 0);
    uVar1 = this->_state;
  }
  if (((__args & 4) != (uVar1 & 4)) &&
     ((this->on_blue_up).super__Function_base._M_manager != (_Manager_type)0x0)) {
    std::function<void_(bool)>::operator()(&this->on_blue_up,(__args & 4) != 0);
    uVar1 = this->_state;
  }
  if (((__args & 8) != (uVar1 & 8)) &&
     ((this->on_blue_down).super__Function_base._M_manager != (_Manager_type)0x0)) {
    std::function<void_(bool)>::operator()(&this->on_blue_down,(__args & 8) != 0);
    uVar1 = this->_state;
  }
  if (((__args & 0x10) != (uVar1 & 0x10)) &&
     ((this->on_beacon).super__Function_base._M_manager != (_Manager_type)0x0)) {
    std::function<void_(bool)>::operator()(&this->on_beacon,(__args & 0x10) != 0);
    uVar1 = this->_state;
  }
  if ((__args != uVar1) &&
     ((this->on_state_change).super__Function_base._M_manager != (_Manager_type)0x0)) {
    std::function<void_(int)>::operator()(&this->on_state_change,__args);
  }
  this->_state = __args;
  return;
}

Assistant:

void remote_control::on_value_changed(int value) {
    int new_state = 0;

    switch (value) {
        case 1:
            new_state = red_up;
            break;
        case 2:
            new_state = red_down;
            break;
        case 3:
            new_state = blue_up;
            break;
        case  4:
            new_state = blue_down;
            break;
        case 5:
            new_state = red_up | blue_up;
            break;
        case 6:
            new_state = red_up | blue_down;
            break;
        case 7:
            new_state = red_down |  blue_up;
            break;
        case 8:
            new_state = red_down | blue_down;
            break;
        case 9:
            new_state = beacon;
            break;
        case 10:
            new_state = red_up | red_down;
            break;
        case 11:
            new_state = blue_up | blue_down;
            break;
    }

    if (((new_state & red_up) != (_state & red_up)) &&
            static_cast<bool>(on_red_up))
        on_red_up(new_state & red_up);

    if (((new_state & red_down) != (_state & red_down)) &&
            static_cast<bool>(on_red_down))
        on_red_down(new_state & red_down);

    if (((new_state & blue_up) != (_state & blue_up)) &&
            static_cast<bool>(on_blue_up))
        on_blue_up(new_state & blue_up);

    if (((new_state & blue_down) != (_state & blue_down)) &&
            static_cast<bool>(on_blue_down))
        on_blue_down(new_state & blue_down);

    if (((new_state & beacon) != (_state & beacon)) &&
            static_cast<bool>(on_beacon))
        on_beacon(new_state & beacon);

    if ((new_state != _state) &&
            static_cast<bool>(on_state_change))
        on_state_change(new_state);

    _state = new_state;
}